

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Track::set_codec_id(Track *this,char *codec_id)

{
  size_t sVar1;
  char *__dest;
  
  if (codec_id != (char *)0x0) {
    if (this->codec_id_ != (char *)0x0) {
      operator_delete__(this->codec_id_);
    }
    sVar1 = strlen(codec_id);
    __dest = (char *)operator_new__(sVar1 + 1,(nothrow_t *)&std::nothrow);
    this->codec_id_ = __dest;
    if (__dest != (char *)0x0) {
      strcpy(__dest,codec_id);
      return;
    }
  }
  return;
}

Assistant:

void Track::set_codec_id(const char* codec_id) {
  if (codec_id) {
    delete[] codec_id_;

    const size_t length = strlen(codec_id) + 1;
    codec_id_ = new (std::nothrow) char[length];  // NOLINT
    if (codec_id_) {
#ifdef _MSC_VER
      strcpy_s(codec_id_, length, codec_id);
#else
      strcpy(codec_id_, codec_id);
#endif
    }
  }
}